

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

int setElementTypePrefix(XML_Parser parser,ELEMENT_TYPE *elementType)

{
  XML_Char XVar1;
  XML_Char *pXVar2;
  undefined1 *puVar3;
  int iVar4;
  PREFIX *pPVar5;
  PREFIX *local_38;
  XML_Char *s;
  PREFIX *prefix;
  XML_Char *name;
  ELEMENT_TYPE *elementType_local;
  XML_Parser parser_local;
  
  prefix = (PREFIX *)elementType->name;
  do {
    if (*(char *)&prefix->name == '\0') {
      return 1;
    }
    if (*(char *)&prefix->name == ':') {
      for (local_38 = (PREFIX *)elementType->name; local_38 != prefix;
          local_38 = (PREFIX *)((long)&local_38->name + 1)) {
        if ((*(long *)((long)parser + 0x348) == *(long *)((long)parser + 0x340)) &&
           (iVar4 = poolGrow((STRING_POOL *)((long)parser + 0x330)), iVar4 == 0)) {
          return 0;
        }
        XVar1 = *(XML_Char *)&local_38->name;
        pXVar2 = *(XML_Char **)((long)parser + 0x348);
        *(XML_Char **)((long)parser + 0x348) = pXVar2 + 1;
        *pXVar2 = XVar1;
      }
      if ((*(long *)((long)parser + 0x348) == *(long *)((long)parser + 0x340)) &&
         (iVar4 = poolGrow((STRING_POOL *)((long)parser + 0x330)), iVar4 == 0)) {
        return 0;
      }
      puVar3 = *(undefined1 **)((long)parser + 0x348);
      *(undefined1 **)((long)parser + 0x348) = puVar3 + 1;
      *puVar3 = 0;
      pPVar5 = (PREFIX *)
               lookup((HASH_TABLE *)((long)parser + 0x308),*(KEY *)((long)parser + 0x350),0x10);
      if (pPVar5 == (PREFIX *)0x0) {
        return 0;
      }
      if (pPVar5->name == *(KEY *)((long)parser + 0x350)) {
        *(undefined8 *)((long)parser + 0x350) = *(undefined8 *)((long)parser + 0x348);
      }
      else {
        *(undefined8 *)((long)parser + 0x348) = *(undefined8 *)((long)parser + 0x350);
      }
      elementType->prefix = pPVar5;
    }
    prefix = (PREFIX *)((long)&prefix->name + 1);
  } while( true );
}

Assistant:

static int setElementTypePrefix(XML_Parser parser, ELEMENT_TYPE *elementType)
{
  const XML_Char *name;
  for (name = elementType->name; *name; name++) {
    if (*name == XML_T(':')) {
      PREFIX *prefix;
      const XML_Char *s;
      for (s = elementType->name; s != name; s++) {
        if (!poolAppendChar(&dtd.pool, *s))
          return 0;
      }
      if (!poolAppendChar(&dtd.pool, XML_T('\0')))
        return 0;
      prefix = (PREFIX *)lookup(&dtd.prefixes, poolStart(&dtd.pool), sizeof(PREFIX));
      if (!prefix)
        return 0;
      if (prefix->name == poolStart(&dtd.pool))
        poolFinish(&dtd.pool);
      else
        poolDiscard(&dtd.pool);
      elementType->prefix = prefix;

    }
  }
  return 1;
}